

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::_unknownCommandHandler(Server *this,Pointer *client,string *command)

{
  ostream *poVar1;
  type this_00;
  string *psVar2;
  string *command_local;
  Pointer *client_local;
  Server *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Unknown command \"");
  poVar1 = std::operator<<(poVar1,(string *)command);
  poVar1 = std::operator<<(poVar1,"\" issued by ");
  this_00 = boost::shared_ptr<ClientConnection>::operator->(client);
  psVar2 = ClientConnection::getName_abi_cxx11_(this_00);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void _unknownCommandHandler( ClientConnection::Pointer client, const string& command ){
        cerr << "Unknown command \"" << command << "\" issued by " << client->getName() << endl;
    }